

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

void accum_global_gauden(vector_t ***acc,vector_t ***l_acc,gauden_t *g,uint32 *lcl2glb,
                        uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_48;
  uint local_44;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 ii;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_lcl2glb_local;
  uint32 *lcl2glb_local;
  gauden_t *g_local;
  vector_t ***l_acc_local;
  vector_t ***acc_local;
  
  if (acc != (vector_t ***)0x0) {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    for (j = 0; j < n_lcl2glb; j = j + 1) {
      uVar3 = lcl2glb[j];
      for (l = 0; l < uVar1; l = l + 1) {
        for (local_44 = 0; local_44 < uVar2; local_44 = local_44 + 1) {
          for (local_48 = 0; local_48 < g->veclen[l]; local_48 = local_48 + 1) {
            acc[uVar3][l][local_44][local_48] =
                 l_acc[j][l][local_44][local_48] + acc[uVar3][l][local_44][local_48];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
accum_global_gauden(vector_t ***acc,
		    vector_t ***l_acc,
		    gauden_t *g,
		    uint32 *lcl2glb,
		    uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k, l;

    if (acc == NULL) {
	/* nothing to do */

	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    /* for each mixture density */
    for (ii = 0; ii < n_lcl2glb; ii++) {
	/* map local density id to global one */
	i = lcl2glb[ii];

	/* for each feature */
	for (j = 0; j < n_feat; j++) {

	    /* for each density in the mixture density */
	    for (k = 0; k < n_density; k++) {
		
		for (l = 0; l < g->veclen[j]; l++) {
		    acc[i][j][k][l] += l_acc[ii][j][k][l];
		}
	    }
	}
    }
}